

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertices.cpp
# Opt level: O2

void fw::Vertex3DNormal2TexCoord::setupAttribPointers(void)

{
  (*glad_glEnableVertexAttribArray)(0);
  (*glad_glVertexAttribPointer)(0,3,0x1406,'\0',0x28,(void *)0x0);
  (*glad_glEnableVertexAttribArray)(1);
  (*glad_glVertexAttribPointer)(1,3,0x1406,'\0',0x28,(void *)0xc);
  (*glad_glEnableVertexAttribArray)(2);
  (*glad_glVertexAttribPointer)(2,2,0x1406,'\0',0x28,(void *)0x18);
  (*glad_glEnableVertexAttribArray)(3);
  (*glad_glVertexAttribPointer)(3,2,0x1406,'\0',0x28,(void *)0x20);
  return;
}

Assistant:

void Vertex3DNormal2TexCoord::setupAttribPointers()
{
    glEnableVertexAttribArray(0);
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE,
        sizeof(Vertex3DNormal2TexCoord),
        reinterpret_cast<GLvoid*>(0)
    );

    glEnableVertexAttribArray(1);
    glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE,
        sizeof(Vertex3DNormal2TexCoord),
        reinterpret_cast<GLvoid*>(offsetof(Vertex3DNormal2TexCoord, normal))
    );

    glEnableVertexAttribArray(2);
    glVertexAttribPointer(2, 2, GL_FLOAT, GL_FALSE,
        sizeof(Vertex3DNormal2TexCoord),
        reinterpret_cast<GLvoid*>(offsetof(Vertex3DNormal2TexCoord, texCoord1))
    );

    glEnableVertexAttribArray(3);
    glVertexAttribPointer(3, 2, GL_FLOAT, GL_FALSE,
        sizeof(Vertex3DNormal2TexCoord),
        reinterpret_cast<GLvoid*>(offsetof(Vertex3DNormal2TexCoord, texCoord2))
    );
}